

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
::find_or_prepare_insert<cs::token_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base*>,phmap::priv::HashEq<cs::token_base*,void>::Hash,phmap::priv::HashEq<cs::token_base*,void>::Eq,std::allocator<cs::token_base*>>
           *this,token_base **key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  ulong uVar9;
  long lVar10;
  __m128i match;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  pair<unsigned_long,_bool> pVar18;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  
  uVar2 = *(ulong *)(this + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar9 = hashval >> 7;
  auVar11 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar11 = pshuflw(auVar11,auVar11,0);
  lVar10 = 0;
  do {
    uVar9 = uVar9 & uVar2;
    pcVar1 = (char *)(*(long *)this + uVar9);
    cVar5 = pcVar1[0xf];
    cVar13 = auVar11[0];
    auVar14[0] = -(cVar13 == *pcVar1);
    cVar15 = auVar11[1];
    auVar14[1] = -(cVar15 == pcVar1[1]);
    cVar16 = auVar11[2];
    auVar14[2] = -(cVar16 == pcVar1[2]);
    cVar17 = auVar11[3];
    auVar14[3] = -(cVar17 == pcVar1[3]);
    auVar14[4] = -(cVar13 == pcVar1[4]);
    auVar14[5] = -(cVar15 == pcVar1[5]);
    auVar14[6] = -(cVar16 == pcVar1[6]);
    auVar14[7] = -(cVar17 == pcVar1[7]);
    auVar14[8] = -(cVar13 == pcVar1[8]);
    auVar14[9] = -(cVar15 == pcVar1[9]);
    auVar14[10] = -(cVar16 == pcVar1[10]);
    auVar14[0xb] = -(cVar17 == pcVar1[0xb]);
    auVar14[0xc] = -(cVar13 == pcVar1[0xc]);
    auVar14[0xd] = -(cVar15 == pcVar1[0xd]);
    auVar14[0xe] = -(cVar16 == pcVar1[0xe]);
    auVar14[0xf] = -(cVar17 == cVar5);
    uVar4 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf;
    if (uVar4 != 0) {
      uVar6 = (uint)uVar4;
      do {
        uVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar7 = uVar3 + uVar9 & uVar2;
        if (*(token_base **)(*(long *)(this + 8) + uVar7 * 8) == *key) {
          uVar8 = 0;
          goto LAB_00133064;
        }
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
    auVar12[0] = -(*pcVar1 == -0x80);
    auVar12[1] = -(pcVar1[1] == -0x80);
    auVar12[2] = -(pcVar1[2] == -0x80);
    auVar12[3] = -(pcVar1[3] == -0x80);
    auVar12[4] = -(pcVar1[4] == -0x80);
    auVar12[5] = -(pcVar1[5] == -0x80);
    auVar12[6] = -(pcVar1[6] == -0x80);
    auVar12[7] = -(pcVar1[7] == -0x80);
    auVar12[8] = -(pcVar1[8] == -0x80);
    auVar12[9] = -(pcVar1[9] == -0x80);
    auVar12[10] = -(pcVar1[10] == -0x80);
    auVar12[0xb] = -(pcVar1[0xb] == -0x80);
    auVar12[0xc] = -(pcVar1[0xc] == -0x80);
    auVar12[0xd] = -(pcVar1[0xd] == -0x80);
    auVar12[0xe] = -(pcVar1[0xe] == -0x80);
    auVar12[0xf] = -(cVar5 == -0x80);
    if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar12 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar12 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar12 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar12 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar12 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar12 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80) {
      uVar7 = raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
              ::prepare_insert((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
                                *)this,hashval);
      uVar8 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00133064:
      pVar18._8_8_ = uVar8;
      pVar18.first = uVar7;
      return pVar18;
    }
    uVar9 = uVar9 + lVar10 + 0x10;
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}